

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

long __thiscall PFData::getPointOffset(PFData *this,int z,int y,int x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int gridIdx;
  int gridIdx_00;
  int gridIdx_01;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  gridIdx = getSubgridIndexZ(this,z);
  gridIdx_00 = getSubgridIndexY(this,y);
  gridIdx_01 = getSubgridIndexX(this,x);
  iVar5 = getSubgridStartZ(this,gridIdx);
  iVar6 = getSubgridStartY(this,gridIdx_00);
  iVar7 = getSubgridStartX(this,gridIdx_01);
  iVar1 = this->m_p;
  iVar2 = this->m_ny;
  iVar3 = this->m_nx;
  iVar4 = this->m_q;
  lVar8 = getSubgridOffset(this,gridIdx,gridIdx_00,gridIdx_01);
  return lVar8 + (int)(((((uint)(gridIdx_00 < iVar2 % iVar4) + iVar2 / iVar1) * (z - iVar5) +
                        (y - iVar6)) * ((uint)(gridIdx_01 < iVar3 % iVar1) + iVar3 / iVar1) +
                       (x - iVar7)) * 8) + 0x24;
}

Assistant:

long PFData::getPointOffset(int z, int y, int x) const{
    const int gridZ = getSubgridIndexZ(z);
    const int gridY = getSubgridIndexY(y);
    const int gridX = getSubgridIndexX(x);

    const int remZ = z - getSubgridStartZ(gridZ);
    const int remY = y - getSubgridStartY(gridY);
    const int remX = x - getSubgridStartX(gridX);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const long subgridOffset = getSubgridOffset(gridZ, gridY, gridX) + 36;  //Skip header
    const long pointOffset = 8 * ((remZ * sizeY * sizeX) + (remY * sizeX) + remX);
    return subgridOffset + pointOffset;
}